

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

bool death_prog_barbas(CHAR_DATA *mob,CHAR_DATA *killer)

{
  int iVar1;
  AFFECT_DATA *arg1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  AFFECT_DATA *af;
  bool in_stack_000000bf;
  CHAR_DATA *in_stack_000000c0;
  void *in_stack_ffffffffffffffd8;
  PC_DATA *pPVar2;
  bool local_1;
  
  arg1 = affect_find(*(AFFECT_DATA **)(in_RDI + 0x88),(int)gsn_lesser_demon);
  if (arg1 == (AFFECT_DATA *)0x0) {
    local_1 = false;
  }
  else {
    act(in_RDI,in_RSI,arg1,in_stack_ffffffffffffffd8,0);
    if (in_RSI == arg1->owner) {
      send_to_char(in_RDI,in_RSI);
      in_RSI->pcdata->lesserdata[0] = 2;
      pPVar2 = in_RSI->pcdata;
      iVar1 = skill_lookup((char *)in_RSI);
      pPVar2->learned[iVar1] = 1;
      extract_char(in_stack_000000c0,in_stack_000000bf);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool death_prog_barbas(CHAR_DATA *mob, CHAR_DATA *killer)
{
	AFFECT_DATA *af;

	af = affect_find(mob->affected, gsn_lesser_demon);
	if (!af)
		return false;

	act("Emitting a ghastly grunt, Barbas falls to the ground in a heap and disappears.", mob, 0, 0, TO_ROOM);

	if (killer != af->owner)
		return false;

	send_to_char("You feel a gluttonous lust enter your body as you stand victorious!\n\r", killer);

	killer->pcdata->lesserdata[LESSER_BARBAS] = FAVOR_GRANTED;
	killer->pcdata->learned[skill_lookup("consume")] = 1;

	extract_char(mob, true);

	return true;
}